

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3TermSelect(Fts3Table *p,Fts3PhraseToken *pTok,int iColumn,int *pnOut,char **ppOut)

{
  char *a2;
  int iVar1;
  void *__dest;
  int i;
  int n1;
  size_t __n;
  char *pcVar2;
  Fts3MultiSegReader *pCsr;
  char *pcVar3;
  long lVar4;
  int nNew;
  Fts3MultiSegReader *local_138;
  Fts3Table *local_130;
  char *aNew;
  char **local_120;
  int *local_118;
  Fts3PhraseToken *local_110;
  void *local_108 [15];
  char *pcStack_90;
  int local_88 [16];
  Fts3SegFilter filter;
  
  pCsr = pTok->pSegcsr;
  local_120 = ppOut;
  local_118 = pnOut;
  memset(local_108,0,0xc0);
  filter.flags = (uint)(pTok->bFirst != 0) * 0x20 + (uint)(pTok->isPrefix != 0) * 8 + 3 +
                 (uint)(iColumn < p->nColumn) * 4;
  filter.zTerm = pTok->z;
  filter.nTerm = pTok->n;
  local_130 = p;
  local_110 = pTok;
  filter.iCol = iColumn;
  iVar1 = sqlite3Fts3SegReaderStart(p,pCsr,&filter);
  local_138 = pCsr;
LAB_001a65c4:
  if (iVar1 == 0) {
    iVar1 = sqlite3Fts3SegReaderStep(local_130,pCsr);
    if (iVar1 != 100) {
      if (iVar1 == 0) {
        lVar4 = 0;
        pcVar2 = (char *)0x0;
        iVar1 = 0;
        goto LAB_001a6712;
      }
      goto LAB_001a67d8;
    }
    pcVar2 = pCsr->aDoclist;
    n1 = pCsr->nDoclist;
    if (local_108[0] == (void *)0x0) {
      __dest = sqlite3_malloc(n1 + 0xb);
      local_108[0] = __dest;
      local_88[0] = n1;
      iVar1 = 7;
      if (__dest != (void *)0x0) {
        __n = (size_t)n1;
        memcpy(__dest,pcVar2,__n);
        *(undefined8 *)((long)__dest + __n) = 0;
        *(undefined2 *)((long)__dest + __n + 8) = 0;
        iVar1 = 0;
      }
    }
    else {
      lVar4 = 0;
      pcVar3 = pcVar2;
      while( true ) {
        pCsr = local_138;
        iVar1 = 0;
        if (lVar4 == 0x40) break;
        a2 = *(char **)((long)local_108 + lVar4 * 2);
        if (a2 == (char *)0x0) {
          *(char **)((long)local_108 + lVar4 * 2) = pcVar3;
          *(int *)((long)local_88 + lVar4) = n1;
          iVar1 = 0;
          break;
        }
        iVar1 = fts3DoclistOrMerge((uint)local_130->bDescIdx,pcVar3,n1,a2,
                                   *(int *)((long)local_88 + lVar4),&aNew,&nNew);
        if (iVar1 != 0) {
          pCsr = local_138;
          if (pcVar3 != pcVar2) {
            sqlite3_free(pcVar3);
            pCsr = local_138;
          }
          break;
        }
        if (pcVar3 != pcVar2) {
          sqlite3_free(pcVar3);
        }
        sqlite3_free(a2);
        *(undefined8 *)((long)local_108 + lVar4 * 2) = 0;
        if (lVar4 == 0x3c) {
          pcStack_90 = aNew;
          local_88[0xf] = nNew;
        }
        lVar4 = lVar4 + 4;
        pcVar3 = aNew;
        n1 = nNew;
      }
    }
    goto LAB_001a65c4;
  }
LAB_001a67d8:
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    sqlite3_free(local_108[lVar4]);
  }
LAB_001a67a8:
  fts3SegReaderCursorFree(pCsr);
  local_110->pSegcsr = (Fts3MultiSegReader *)0x0;
  return iVar1;
LAB_001a6712:
  if (lVar4 == 0x10) goto LAB_001a6797;
  pcVar3 = (char *)local_108[lVar4];
  if (pcVar3 != (char *)0x0) {
    if (pcVar2 == (char *)0x0) {
      iVar1 = local_88[lVar4];
      local_108[lVar4] = (void *)0x0;
      pcVar2 = pcVar3;
    }
    else {
      iVar1 = fts3DoclistOrMerge((uint)local_130->bDescIdx,pcVar3,local_88[lVar4],pcVar2,iVar1,&aNew
                                 ,&nNew);
      if (iVar1 != 0) {
        sqlite3_free(pcVar2);
        goto LAB_001a67d8;
      }
      sqlite3_free(local_108[lVar4]);
      sqlite3_free(pcVar2);
      local_108[lVar4] = (void *)0x0;
      pcVar2 = aNew;
      iVar1 = nNew;
    }
  }
  lVar4 = lVar4 + 1;
  goto LAB_001a6712;
LAB_001a6797:
  *local_120 = pcVar2;
  *local_118 = iVar1;
  iVar1 = 0;
  goto LAB_001a67a8;
}

Assistant:

static int fts3TermSelect(
  Fts3Table *p,                   /* Virtual table handle */
  Fts3PhraseToken *pTok,          /* Token to query for */
  int iColumn,                    /* Column to query (or -ve for all columns) */
  int *pnOut,                     /* OUT: Size of buffer at *ppOut */
  char **ppOut                    /* OUT: Malloced result buffer */
){
  int rc;                         /* Return code */
  Fts3MultiSegReader *pSegcsr;    /* Seg-reader cursor for this term */
  TermSelect tsc;                 /* Object for pair-wise doclist merging */
  Fts3SegFilter filter;           /* Segment term filter configuration */

  pSegcsr = pTok->pSegcsr;
  memset(&tsc, 0, sizeof(TermSelect));

  filter.flags = FTS3_SEGMENT_IGNORE_EMPTY | FTS3_SEGMENT_REQUIRE_POS
        | (pTok->isPrefix ? FTS3_SEGMENT_PREFIX : 0)
        | (pTok->bFirst ? FTS3_SEGMENT_FIRST : 0)
        | (iColumn<p->nColumn ? FTS3_SEGMENT_COLUMN_FILTER : 0);
  filter.iCol = iColumn;
  filter.zTerm = pTok->z;
  filter.nTerm = pTok->n;

  rc = sqlite3Fts3SegReaderStart(p, pSegcsr, &filter);
  while( SQLITE_OK==rc
      && SQLITE_ROW==(rc = sqlite3Fts3SegReaderStep(p, pSegcsr)) 
  ){
    rc = fts3TermSelectMerge(p, &tsc, pSegcsr->aDoclist, pSegcsr->nDoclist);
  }

  if( rc==SQLITE_OK ){
    rc = fts3TermSelectFinishMerge(p, &tsc);
  }
  if( rc==SQLITE_OK ){
    *ppOut = tsc.aaOutput[0];
    *pnOut = tsc.anOutput[0];
  }else{
    int i;
    for(i=0; i<SizeofArray(tsc.aaOutput); i++){
      sqlite3_free(tsc.aaOutput[i]);
    }
  }

  fts3SegReaderCursorFree(pSegcsr);
  pTok->pSegcsr = 0;
  return rc;
}